

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::~DescriptorPoolTypeResolver
          (DescriptorPoolTypeResolver *this)

{
  pointer pcVar1;
  
  (this->super_TypeResolver)._vptr_TypeResolver =
       (_func_int **)&PTR__DescriptorPoolTypeResolver_003c9640;
  pcVar1 = (this->url_prefix_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->url_prefix_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

DescriptorPoolTypeResolver(const std::string& url_prefix,
                             const DescriptorPool* pool)
      : url_prefix_(url_prefix), pool_(pool) {}